

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void nn_sha1_add(nn_sha1 *self,uint8_t data)

{
  uint uVar1;
  int iVar2;
  uint8_t *buf;
  uint32_t t;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint8_t i;
  uint8_t data_local;
  nn_sha1 *self_local;
  
  if (self->is_little_endian == '\0') {
    *(uint8_t *)((long)self->buffer + (ulong)self->buffer_offset) = data;
  }
  else {
    *(uint8_t *)((long)self->buffer + (long)(int)(self->buffer_offset ^ 3)) = data;
  }
  self->buffer_offset = self->buffer_offset + '\x01';
  if (self->buffer_offset == '@') {
    b = self->state[1];
    c = self->state[2];
    d = self->state[3];
    e = self->state[4];
    a = self->state[0];
    for (i = '\0'; i < 0x50; i = i + '\x01') {
      if (0xf < i) {
        uVar1 = self->buffer[(int)(i + 0xd & 0xf)] ^ self->buffer[(int)(i + 8 & 0xf)] ^
                self->buffer[(int)(i + 2 & 0xf)] ^ self->buffer[(int)(i & 0xf)];
        self->buffer[(int)(i & 0xf)] = uVar1 << 1 | uVar1 >> 0x1f;
      }
      if (i < 0x14) {
        t = (d ^ b & (c ^ d)) + 0x5a827999;
      }
      else if (i < 0x28) {
        t = (b ^ c ^ d) + 0x6ed9eba1;
      }
      else if (i < 0x3c) {
        t = (b & c | d & (b | c)) + 0x8f1bbcdc;
      }
      else {
        t = (b ^ c ^ d) + 0xca62c1d6;
      }
      iVar2 = (a << 5 | a >> 0x1b) + e;
      uVar1 = (uint)i;
      e = d;
      d = c;
      c = b << 0x1e | b >> 2;
      b = a;
      a = iVar2 + self->buffer[(int)(uVar1 & 0xf)] + t;
    }
    self->state[0] = a + self->state[0];
    self->state[1] = b + self->state[1];
    self->state[2] = c + self->state[2];
    self->state[3] = d + self->state[3];
    self->state[4] = e + self->state[4];
    self->buffer_offset = '\0';
  }
  return;
}

Assistant:

static void nn_sha1_add (struct nn_sha1 *self, uint8_t data)
{
    uint8_t i;
    uint32_t a, b, c, d, e, t;
    uint8_t * const buf = (uint8_t*) self->buffer;

    if (self->is_little_endian)
        buf [self->buffer_offset ^ 3] = data;
    else
        buf [self->buffer_offset] = data;

    self->buffer_offset++;
    if (self->buffer_offset == SHA1_BLOCK_LEN) {
        a = self->state [0];
        b = self->state [1];
        c = self->state [2];
        d = self->state [3];
        e = self->state [4];
        for (i = 0; i < 80; i++) {
            if (i >= 16) {
                t = self->buffer [(i + 13) & 15] ^
                    self->buffer [(i + 8) & 15] ^
                    self->buffer [(i + 2) & 15] ^
                    self->buffer [i & 15];
                self->buffer [i & 15] = sha1_rol32 (t, 1);
            }

            if (i < 20)
                t = (d ^ (b & (c ^ d))) + 0x5A827999;
            else if (i < 40)
                t = (b ^ c ^ d) + 0x6ED9EBA1;
            else if (i < 60)
                t = ((b & c) | (d & (b | c))) + 0x8F1BBCDC;
            else
                t = (b ^ c ^ d) + 0xCA62C1D6;

            t += sha1_rol32 (a, 5) + e + self->buffer [i & 15];
            e = d;
            d = c;
            c = sha1_rol32 (b, 30);
            b = a;
            a = t;
        }

        self->state [0] += a;
        self->state [1] += b;
        self->state [2] += c;
        self->state [3] += d;
        self->state [4] += e;

        self->buffer_offset = 0;
    }
}